

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O1

uint32_t Predictor13_SSE2(uint32_t *left,uint32_t *top)

{
  uint32_t uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ushort uVar5;
  short sVar6;
  undefined1 uVar8;
  undefined1 uVar9;
  short sVar10;
  undefined1 uVar11;
  short sVar12;
  short sVar13;
  undefined1 auVar7 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ushort uVar16;
  ushort uVar17;
  
  uVar1 = *left;
  uVar11 = (undefined1)(uVar1 >> 0x18);
  uVar9 = (undefined1)(uVar1 >> 0x10);
  uVar8 = (undefined1)(uVar1 >> 8);
  uVar2 = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11(uVar11,uVar11),uVar9),
                                                    CONCAT14(uVar9,uVar1)) >> 0x20),uVar8),uVar8),
                   CONCAT11((char)uVar1,(char)uVar1));
  uVar1 = *top;
  uVar11 = (undefined1)(uVar1 >> 0x18);
  uVar9 = (undefined1)(uVar1 >> 0x10);
  uVar8 = (undefined1)(uVar1 >> 8);
  uVar3 = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11(uVar11,uVar11),uVar9),
                                                    CONCAT14(uVar9,uVar1)) >> 0x20),uVar8),uVar8),
                   CONCAT11((char)uVar1,(char)uVar1));
  uVar1 = top[-1];
  uVar5 = (ushort)(byte)(uVar1 >> 8);
  uVar4 = uVar3 & uVar2;
  uVar3 = uVar3 ^ uVar2;
  auVar14._0_2_ = (ushort)uVar3 >> 1;
  auVar14._2_2_ = (ushort)(uVar3 >> 0x10) >> 1;
  auVar14._4_2_ = (ushort)(uVar3 >> 0x20) >> 1;
  auVar14._6_2_ = (ushort)(uVar3 >> 0x31);
  auVar14._8_8_ = 0;
  auVar14 = auVar14 & _DAT_001261b0;
  auVar15[0] = auVar14[0] + (char)uVar4;
  auVar15[1] = auVar14[1] + (char)(uVar4 >> 8);
  auVar15[2] = auVar14[2] + (char)(uVar4 >> 0x10);
  auVar15[3] = auVar14[3] + (char)(uVar4 >> 0x18);
  auVar15[4] = auVar14[4] + (char)(uVar4 >> 0x20);
  auVar15[5] = auVar14[5] + (char)(uVar4 >> 0x28);
  auVar15[6] = auVar14[6] + (char)(uVar4 >> 0x30);
  auVar15[7] = auVar14[7] + (char)(uVar4 >> 0x38);
  auVar15[8] = auVar14[8];
  auVar15[9] = auVar14[9];
  auVar15[10] = auVar14[10];
  auVar15[0xb] = auVar14[0xb];
  auVar15[0xc] = auVar14[0xc];
  auVar15[0xd] = auVar14[0xd];
  auVar15[0xe] = auVar14[0xe];
  auVar15[0xf] = auVar14[0xf];
  auVar15 = auVar15 & _DAT_00126580;
  sVar6 = auVar15._0_2_;
  sVar10 = auVar15._2_2_;
  sVar12 = auVar15._4_2_;
  uVar16 = (ushort)(byte)(uVar1 >> 0x10);
  sVar13 = auVar15._6_2_;
  uVar17 = (ushort)(byte)(uVar1 >> 0x18);
  auVar7._0_2_ = (sVar6 - (ushort)(byte)uVar1) + (ushort)(sVar6 < (short)(ushort)(byte)uVar1);
  auVar7._2_2_ = (sVar10 - uVar5) + (ushort)(sVar10 < (short)uVar5);
  auVar7._4_2_ = (sVar12 - uVar16) + (ushort)(sVar12 < (short)uVar16);
  auVar7._6_2_ = (sVar13 - uVar17) + (ushort)(sVar13 < (short)uVar17);
  auVar7._8_2_ = auVar15._8_2_ + (ushort)(auVar15._8_2_ < 0);
  auVar7._10_2_ = auVar15._10_2_ + (ushort)(auVar15._10_2_ < 0);
  auVar7._12_2_ = auVar15._12_2_ + (ushort)(auVar15._12_2_ < 0);
  auVar7._14_2_ = auVar15._14_2_ + (ushort)(auVar15._14_2_ < 0);
  auVar7 = psraw(auVar7,1);
  sVar6 = auVar7._0_2_ + sVar6;
  sVar10 = auVar7._2_2_ + sVar10;
  sVar12 = auVar7._4_2_ + sVar12;
  sVar13 = auVar7._6_2_ + sVar13;
  return CONCAT13((0 < sVar13) * (sVar13 < 0x100) * (char)sVar13 - (0xff < sVar13),
                  CONCAT12((0 < sVar12) * (sVar12 < 0x100) * (char)sVar12 - (0xff < sVar12),
                           CONCAT11((0 < sVar10) * (sVar10 < 0x100) * (char)sVar10 - (0xff < sVar10)
                                    ,(0 < sVar6) * (sVar6 < 0x100) * (char)sVar6 - (0xff < sVar6))))
  ;
}

Assistant:

static WEBP_INLINE uint32_t ClampedAddSubtractHalf_SSE2(uint32_t c0,
                                                        uint32_t c1,
                                                        uint32_t c2) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i C0 = _mm_unpacklo_epi8(_mm_cvtsi32_si128((int)c0), zero);
  const __m128i C1 = _mm_unpacklo_epi8(_mm_cvtsi32_si128((int)c1), zero);
  const __m128i B0 = _mm_unpacklo_epi8(_mm_cvtsi32_si128((int)c2), zero);
  const __m128i avg = _mm_add_epi16(C1, C0);
  const __m128i A0 = _mm_srli_epi16(avg, 1);
  const __m128i A1 = _mm_sub_epi16(A0, B0);
  const __m128i BgtA = _mm_cmpgt_epi16(B0, A0);
  const __m128i A2 = _mm_sub_epi16(A1, BgtA);
  const __m128i A3 = _mm_srai_epi16(A2, 1);
  const __m128i A4 = _mm_add_epi16(A0, A3);
  const __m128i A5 = _mm_packus_epi16(A4, A4);
  return (uint32_t)_mm_cvtsi128_si32(A5);
}